

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

shared_ptr<AixLog::SinkCout> AixLog::Log::init<AixLog::SinkCout,AixLog::Severity&>(Severity *params)

{
  Log *params_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<AixLog::SinkCout> sVar1;
  initializer_list<std::shared_ptr<AixLog::Sink>_> __l;
  allocator_type local_39;
  __shared_ptr<AixLog::Sink,(__gnu_cxx::_Lock_policy)2> local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_> local_28;
  
  params_00 = instance();
  add_logsink<AixLog::SinkCout,AixLog::Severity&>((Log *)params,(Severity *)params_00);
  std::__shared_ptr<AixLog::Sink,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<AixLog::SinkCout,void>
            (local_38,(__shared_ptr<AixLog::SinkCout,_(__gnu_cxx::_Lock_policy)2> *)params);
  __l._M_len = 1;
  __l._M_array = (iterator)local_38;
  std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>::
  vector(&local_28,__l,&local_39);
  init((EVP_PKEY_CTX *)&local_28);
  std::vector<std::shared_ptr<AixLog::Sink>,_std::allocator<std::shared_ptr<AixLog::Sink>_>_>::
  ~vector(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  sVar1.super___shared_ptr<AixLog::SinkCout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<AixLog::SinkCout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)params;
  return (shared_ptr<AixLog::SinkCout>)
         sVar1.super___shared_ptr<AixLog::SinkCout,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<T> init(Ts&&... params) {
    std::shared_ptr<T> sink =
        Log::instance().add_logsink<T>(std::forward<Ts>(params)...);
    init({sink});
    return sink;
  }